

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::getForwardSolutions(IMLE *this)

{
  X *__value;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer pdVar8;
  pointer pFVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  long lVar13;
  Index index_6;
  long lVar14;
  ActualDstType actualDst;
  ulong uVar15;
  iterator __position;
  Index size_1;
  Index index;
  ulong uVar16;
  Index index_1;
  Index index_3;
  ulong uVar17;
  long lVar18;
  pointer pMVar19;
  long lVar20;
  ArrayX *this_00;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  ArrayX sumInvRxj;
  ArrayX sumInvRj;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_98;
  ArrayScal *local_88;
  ArrayX *local_80;
  ArrayX *local_78;
  X *local_70;
  X *local_68;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_60;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  __value = &this->zeroX;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(&local_48,(long)this->nSolFound,__value,(allocator_type *)&local_60);
  local_68 = __value;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(&local_60,(long)this->nSolFound,__value,(allocator_type *)&local_98);
  pMVar6 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->predictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar19 = pMVar6;
  if (pMVar7 != pMVar6) {
    do {
      free((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar19 = pMVar19 + 1;
    } while (pMVar19 != pMVar7);
    (this->predictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pMVar6 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->predictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar19 = pMVar6;
  if (pMVar7 != pMVar6) {
    do {
      free((pMVar19->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar19 = pMVar19 + 1;
    } while (pMVar19 != pMVar7);
    (this->predictionsVar).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pdVar8 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar8;
  }
  if (0 < this->M) {
    lVar13 = 0;
    lVar14 = 0;
    do {
      pFVar9 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar23 = pFVar9[lVar14].super_LinearExpert.gamma * pFVar9[lVar14].super_LinearExpert.p_z_T +
               (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data[(this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14]];
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data[lVar14] = dVar23;
      pdVar10 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      uVar15 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      uVar16 = uVar15;
      if ((((ulong)(pdVar10 + uVar15 * lVar14) & 7) == 0) &&
         (uVar16 = (ulong)((uint)((ulong)(pdVar10 + uVar15 * lVar14) >> 3) & 1),
         (long)uVar15 <= (long)uVar16)) {
        uVar16 = uVar15;
      }
      dVar23 = pFVar9[lVar14].super_LinearExpert.p_z_T / dVar23;
      lVar11 = *(long *)&pFVar9[lVar14].super_LinearExpert.invPsi.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
      if (0 < (long)uVar16) {
        uVar17 = 0;
        do {
          *(double *)((long)pdVar10 + uVar17 * 8 + uVar15 * lVar13) =
               *(double *)(lVar11 + uVar17 * 8) * dVar23;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      lVar18 = uVar15 - uVar16;
      uVar17 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar18) {
        do {
          pdVar1 = (double *)(lVar11 + uVar16 * 8);
          dVar12 = pdVar1[1];
          pdVar2 = (double *)((long)pdVar10 + uVar16 * 8 + uVar15 * lVar13);
          *pdVar2 = *pdVar1 * dVar23;
          pdVar2[1] = dVar12 * dVar23;
          uVar16 = uVar16 + 2;
        } while ((long)uVar16 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar15) {
        do {
          *(double *)((long)pdVar10 + uVar17 * 8 + uVar15 * lVar13) =
               *(double *)(lVar11 + uVar17 * 8) * dVar23;
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
      pdVar10 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar11 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar1 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      uVar15 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      lVar18 = *(long *)&(this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar14].super_LinearExpert.pred_x
                         .super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
      uVar16 = uVar15;
      if ((((ulong)(pdVar1 + uVar15 * lVar14) & 7) == 0) &&
         (uVar16 = (ulong)((uint)((ulong)(pdVar1 + uVar15 * lVar14) >> 3) & 1),
         (long)uVar15 <= (long)uVar16)) {
        uVar16 = uVar15;
      }
      if (0 < (long)uVar16) {
        uVar17 = 0;
        do {
          *(double *)((long)pdVar1 + uVar17 * 8 + uVar15 * lVar13) =
               *(double *)((long)pdVar10 + uVar17 * 8 + lVar11 * lVar13) *
               *(double *)(lVar18 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      lVar20 = uVar15 - uVar16;
      uVar17 = (lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
      if (1 < lVar20) {
        do {
          pdVar2 = (double *)(lVar18 + uVar16 * 8);
          dVar23 = pdVar2[1];
          pdVar3 = (double *)((long)pdVar10 + uVar16 * 8 + lVar11 * lVar13);
          dVar12 = pdVar3[1];
          pdVar4 = (double *)((long)pdVar1 + uVar16 * 8 + uVar15 * lVar13);
          *pdVar4 = *pdVar3 * *pdVar2;
          pdVar4[1] = dVar12 * dVar23;
          uVar16 = uVar16 + 2;
        } while ((long)uVar16 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar15) {
        do {
          *(double *)((long)pdVar1 + uVar17 * 8 + uVar15 * lVar13) =
               *(double *)((long)pdVar10 + uVar17 * 8 + lVar11 * lVar13) *
               *(double *)(lVar18 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar15 != uVar17);
      }
      pdVar10 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar11 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      iVar5 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      pdVar1 = local_48.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar15 = local_48.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar16 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar15) {
        lVar18 = 0;
        do {
          pdVar2 = (double *)((long)pdVar10 + lVar18 * 8 + lVar11 * lVar13);
          dVar12 = pdVar2[1];
          dVar23 = (pdVar1 + lVar18)[1];
          pdVar1[lVar18] = *pdVar2 + pdVar1[lVar18];
          (pdVar1 + lVar18)[1] = dVar12 + dVar23;
          lVar18 = lVar18 + 2;
        } while (lVar18 < (long)uVar16);
      }
      if ((long)uVar16 < (long)uVar15) {
        do {
          pdVar1[uVar16] =
               *(double *)((long)pdVar10 + uVar16 * 8 + lVar11 * lVar13) + pdVar1[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      pdVar10 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar11 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      iVar5 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      pdVar1 = local_60.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar15 = local_60.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar5].
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar16 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar15) {
        lVar18 = 0;
        do {
          pdVar2 = (double *)((long)pdVar10 + lVar18 * 8 + lVar11 * lVar13);
          dVar12 = pdVar2[1];
          dVar23 = (pdVar1 + lVar18)[1];
          pdVar1[lVar18] = *pdVar2 + pdVar1[lVar18];
          (pdVar1 + lVar18)[1] = dVar12 + dVar23;
          lVar18 = lVar18 + 2;
        } while (lVar18 < (long)uVar16);
      }
      if ((long)uVar16 < (long)uVar15) {
        do {
          pdVar1[uVar16] =
               *(double *)((long)pdVar10 + uVar16 * 8 + lVar11 * lVar13) + pdVar1[uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar14 < this->M);
  }
  if (0 < this->nSolFound) {
    local_80 = &this->predictions;
    this_00 = &this->predictionsVar;
    local_88 = &this->predictionsWeight;
    local_70 = &this->infinityX;
    lVar13 = 0;
    local_78 = this_00;
    do {
      pMVar7 = local_48.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar6 = local_60.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar23 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar13];
      if ((dVar23 != 0.0) || (NAN(dVar23))) {
        local_98.m_storage.m_data = (double *)0x0;
        local_98.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_98,
                   local_48.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        pdVar10 = pMVar6[lVar13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        pdVar1 = pMVar7[lVar13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar15 = pMVar7[lVar13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (local_98.m_storage.m_rows != uVar15) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_98,uVar15,1);
          uVar15 = local_98.m_storage.m_rows;
        }
        uVar16 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar15) {
          lVar14 = 0;
          do {
            auVar21 = divpd(*(undefined1 (*) [16])(pdVar10 + lVar14),
                            *(undefined1 (*) [16])(pdVar1 + lVar14));
            *(undefined1 (*) [16])(local_98.m_storage.m_data + lVar14) = auVar21;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)uVar16);
        }
        if ((long)uVar16 < (long)uVar15) {
          do {
            local_98.m_storage.m_data[uVar16] = pdVar10[uVar16] / pdVar1[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_80,(value_type *)&local_98);
        free(local_98.m_storage.m_data);
        pMVar6 = local_48.
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98.m_storage.m_data = (double *)0x0;
        local_98.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_98,
                   local_48.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        pdVar10 = pMVar6[lVar13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        uVar15 = pMVar6[lVar13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (local_98.m_storage.m_rows != uVar15) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_98,uVar15,1);
          uVar15 = local_98.m_storage.m_rows;
        }
        this_00 = local_78;
        auVar21 = _DAT_0018bd00;
        uVar16 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar15) {
          lVar14 = 0;
          do {
            auVar22 = divpd(auVar21,*(undefined1 (*) [16])(pdVar10 + lVar14));
            *(undefined1 (*) [16])(local_98.m_storage.m_data + lVar14) = auVar22;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)uVar16);
        }
        if ((long)uVar16 < (long)uVar15) {
          do {
            local_98.m_storage.m_data[uVar16] = 1.0 / pdVar10[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_78,(value_type *)&local_98);
        free(local_98.m_storage.m_data);
        local_98.m_storage.m_data =
             (double *)
             ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[lVar13] / this->sumAll);
        __position._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *__position._M_current = (double)local_98.m_storage.m_data;
          goto LAB_0014ae36;
        }
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                  (local_88,__position,(value_type *)&local_98);
      }
      else {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(local_80,local_68);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(this_00,local_70);
        local_98.m_storage.m_data = (double *)0x0;
        __position._M_current =
             (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (local_88,__position,(value_type *)&local_98);
        }
        else {
          *__position._M_current = 0.0;
LAB_0014ae36:
          (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->nSolFound);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_60);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::getForwardSolutions()
{
    // Aux variables
    ArrayX sumInvRj(nSolFound, zeroX);
    ArrayX sumInvRxj(nSolFound, zeroX);

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

    for(int j = 0; j < M; j++)
    {
        /* These 3 variables have already been resized in predict() */
        varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW[sNearest[j]];
        fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
        invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();

        sumInvRj[sNearest[j]] += fInvRj.col(j);
        sumInvRxj[sNearest[j]] += invRxj.col(j);
    }

    // Update storage results
    for( int k = 0; k < nSolFound; k++ )
    {
        if(sum_p_z(k) == 0.0)  // Not likely, but...
        {
            predictions.push_back( zeroX );
            predictionsVar.push_back( infinityX );
            predictionsWeight.push_back( 0.0 );
        }
        else
        {
            predictions.push_back( sumInvRxj[k].cwiseQuotient(sumInvRj[k]) );
            predictionsVar.push_back( sumInvRj[k].cwiseInverse() );
            predictionsWeight.push_back( sum_p_z(k) / sumAll );
        }
    }
}